

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

word wwShHiCarry(word *a,size_t n,size_t shift,word carry)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  word wVar6;
  word wVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar2 = n * 0x40 + 0x40;
  uVar8 = shift - uVar2;
  if (shift < uVar2) {
    uVar2 = shift >> 6;
    bVar1 = (byte)shift;
    bVar3 = bVar1 & 0x3f;
    if (shift < 0x40) {
      wVar7 = 0;
    }
    else {
      wVar7 = a[n - uVar2] << bVar3;
    }
    if ((shift & 0x3f) == 0) {
      uVar8 = n - 1;
      uVar4 = uVar8;
      if (uVar2 < n) {
        do {
          a[uVar8] = a[uVar8 - uVar2];
          bVar9 = uVar2 < uVar8;
          uVar4 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (bVar9);
      }
    }
    else {
      wVar6 = carry;
      if (uVar2 < n) {
        wVar6 = a[~uVar2 + n];
      }
      uVar8 = n - 1;
      bVar9 = n != 0;
      if (uVar2 < uVar8 && bVar9) {
        do {
          n = uVar8;
          a[n] = a[n - uVar2] << (bVar1 & 0x3f) | a[(n - 1) - uVar2] >> 0x40 - (bVar1 & 0x3f);
          uVar8 = n - 1;
        } while (uVar2 < uVar8);
        bVar9 = true;
      }
      wVar7 = wVar6 >> (-bVar3 & 0x3f) | wVar7;
      uVar4 = 0xffffffffffffffff;
      if ((bVar9) && (uVar4 = uVar8, uVar2 < n)) {
        a[uVar8] = a[uVar8 - uVar2] << (bVar1 & 0x3f) | carry >> 0x40 - (bVar1 & 0x3f);
        uVar4 = n - 2;
      }
    }
    if (uVar4 == 0xffffffffffffffff) {
      lVar5 = -1;
    }
    else {
      a[uVar4] = carry << bVar3;
      lVar5 = uVar4 - 1;
    }
    if (lVar5 != -1) {
      memset(a,0,lVar5 * 8 + 8);
    }
  }
  else {
    if (n != 0) {
      memset(a,0,n << 3);
    }
    wVar7 = 0;
    if (uVar8 < 0x40) {
      wVar7 = carry << ((byte)uVar8 & 0x3f);
    }
  }
  return wVar7;
}

Assistant:

word wwShHiCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W;
		size_t pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[n - wshift] << shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[n - wshift - 1] >> (B_PER_W - shift);
			else
				ret |= carry >> (B_PER_W - shift);
			// сдвиг всех слов, кроме первого
			for (pos = n - 1; pos != SIZE_MAX && pos > wshift; pos--)
				a[pos] = a[pos - wshift] << shift | 
					a[pos - wshift - 1] >> (B_PER_W - shift);
			// второе слово
			if (pos != SIZE_MAX && pos + 1 > wshift)
			{
				a[pos] = a[pos - wshift] << shift | carry >> (B_PER_W - shift);
				--pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = n - 1; pos != SIZE_MAX && pos + 1 > wshift; pos--)
				a[pos] = a[pos - wshift];
		}
		// первые слова
		if (pos != SIZE_MAX)
			a[pos--] = carry << shift;
		for (; pos != SIZE_MAX; a[pos--] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry << shift;

	}
	return ret;
}